

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O2

void __thiscall
taylor<double,1,12>::shift<6,double>(taylor<double,1,12> *this,taylor<double,_1,_6> *out,double *dx)

{
  double dVar1;
  int i;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  int j;
  long lVar7;
  int iVar8;
  int i_1;
  double dVar9;
  double dxpow [13];
  
  dxpow[0] = (double)((ulong)dxpow[0] & 0xffffffff00000000);
  taylor<double,1,6>::operator=((taylor<double,1,6> *)out,(int *)dxpow);
  dxpow[0] = 1.0;
  dVar1 = *dx;
  dVar9 = 1.0;
  for (lVar2 = 1; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    dVar9 = dVar9 * dVar1;
    dxpow[lVar2] = dVar9;
  }
  iVar8 = 1;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    lVar6 = 0;
    for (lVar7 = lVar2; lVar7 != 0xd; lVar7 = lVar7 + 1) {
      uVar3 = 1;
      lVar5 = 0;
      while (lVar6 != lVar5) {
        uVar3 = (long)(((int)lVar5 + iVar8) * (int)uVar3) / (long)(int)(lVar5 + 1) & 0xffffffff;
        lVar5 = lVar5 + 1;
      }
      dVar1 = dxpow[lVar7 - lVar2];
      pdVar4 = taylor<double,_1,_12>::operator[]((taylor<double,_1,_12> *)this,(int)lVar7);
      dVar9 = *pdVar4;
      pdVar4 = taylor<double,_1,_6>::operator[](out,(int)lVar2);
      *pdVar4 = (double)(int)uVar3 * dVar1 * dVar9 + *pdVar4;
      lVar6 = lVar6 + 1;
    }
    iVar8 = iVar8 + 1;
  }
  return;
}

Assistant:

void shift(taylor<Tout, 1, NdegOut> & out, const Tout dx[Nvar]) const {
    assert(Nvar == 1);
    assert(NdegOut <= Ndeg);
    T dxpow[Ndeg + 1];
    out = 0;
    dxpow[0] = 1;
    for (int i = 1; i <= Ndeg; i++)
      dxpow[i] = dx[0] * dxpow[i - 1];
    for (int i = 0; i <= NdegOut; i++)
      for (int j = i; j <= Ndeg; j++)
        out[i] += taylorlen(j - i, i) * dxpow[j - i] * (*this)[j];
  }